

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

void __thiscall unittest::UnitTest::TestHashComment2(UnitTest *this)

{
  bool result;
  int iVar1;
  element_type *peVar2;
  mapped_type *this_00;
  mapped_type *a;
  allocator<char> local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator<char> local_291;
  key_type local_290;
  allocator<char> local_269;
  key_type local_268;
  allocator<char> local_241;
  string local_240 [32];
  istringstream local_220 [8];
  istringstream ss;
  shared_ptr<inipp::Format<char>_> local_90;
  undefined1 local_80 [8];
  Ini<char> ini;
  undefined1 local_20 [8];
  shared_ptr<inipp::Format<char>_> fmt;
  UnitTest *this_local;
  
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0x5b;
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 0x5d;
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _5_1_ = 0x3d;
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_1_ = 0x23;
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _3_1_ = 0x24;
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _2_1_ = 0x7b;
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _1_1_ = 0x3a;
  ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_1_ = 0x7d;
  fmt.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::make_shared<inipp::Format<char>,char,char,char,char,char,char,char,char>
            ((char *)local_20,
             (char *)((long)&ini.format.
                             super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7),
             (char *)((long)&ini.format.
                             super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 6),
             (char *)((long)&ini.format.
                             super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 5),
             (char *)((long)&ini.format.
                             super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4),
             (char *)((long)&ini.format.
                             super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 3),
             (char *)((long)&ini.format.
                             super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 2),
             (char *)((long)&ini.format.
                             super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 1));
  std::shared_ptr<inipp::Format<char>_>::shared_ptr
            (&local_90,(shared_ptr<inipp::Format<char>_> *)local_20);
  inipp::Ini<char>::Ini((Ini<char> *)local_80,&local_90);
  std::shared_ptr<inipp::Format<char>_>::~shared_ptr(&local_90);
  peVar2 = std::__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&ini.errors.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size);
  iVar1 = (*peVar2->_vptr_Format[3])(peVar2,0x23);
  Assert::IsTrue((bool)((byte)iVar1 & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,"# hello world\n[default]\na=2",&local_241);
  std::__cxx11::istringstream::istringstream(local_220,local_240,8);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  inipp::Ini<char>::parse
            ((Ini<char> *)local_80,(basic_istream<char,_std::char_traits<char>_> *)local_220);
  WriteMessage<char>((Ini<char> *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"default",&local_269);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)local_80,&local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"a",&local_291);
  a = std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at(this_00,&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"2",&local_2b9);
  Assert::AreEqual<std::__cxx11::string>(a,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  result = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ini.sections._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Assert::IsTrue(result);
  std::__cxx11::istringstream::~istringstream(local_220);
  inipp::Ini<char>::~Ini((Ini<char> *)local_80);
  std::shared_ptr<inipp::Format<char>_>::~shared_ptr((shared_ptr<inipp::Format<char>_> *)local_20);
  return;
}

Assistant:

TEST_METHOD(TestHashComment2)
		{
			auto fmt = std::make_shared<Format<char>>('[', ']', '=', '#', '$', '{', ':', '}');
			Ini<char> ini(fmt);
			Assert::IsTrue(ini.format->is_comment('#'));
			std::istringstream ss("# hello world\n[default]\na=2");
			ini.parse(ss);
			WriteMessage(ini);
			Assert::AreEqual(ini.sections.at("default").at("a"), std::string("2"));
			Assert::IsTrue(ini.errors.empty());
		}